

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::Value(Value *this,Type *t)

{
  Type *t_00;
  size_t __n;
  uchar *d;
  allocator<unsigned_char> local_19;
  Type *local_18;
  Type *t_local;
  Value *this_local;
  
  local_18 = t;
  t_local = (Type *)this;
  __n = Type::getValueDataSize(t);
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->packedData,__n,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  SimpleStringDictionary::SimpleStringDictionary(&this->dictionary);
  t_00 = local_18;
  d = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->packedData);
  ValueView::ValueView(&this->value,t_00,d,&(this->dictionary).super_StringDictionary);
  return;
}

Assistant:

inline Value::Value (Type&& t)
   : packedData (static_cast<std::vector<char>::size_type> (t.getValueDataSize())),
     value (std::move (t), packedData.data(), std::addressof (dictionary))
{
}